

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

StackAction pop_error_callback(void *payload,StackIterator *iterator)

{
  _Bool _Var1;
  _Bool *found_error;
  StackIterator *iterator_local;
  void *payload_local;
  
  if ((iterator->subtrees).size == 0) {
    payload_local._4_4_ = 0;
  }
  else if (((*payload & 1) == 0) &&
          (_Var1 = ts_subtree_is_error(*(iterator->subtrees).contents), _Var1)) {
    *(undefined1 *)payload = 1;
    payload_local._4_4_ = 3;
  }
  else {
    payload_local._4_4_ = 1;
  }
  return payload_local._4_4_;
}

Assistant:

inline StackAction pop_error_callback(void *payload, const StackIterator *iterator) {
  if (iterator->subtrees.size > 0) {
    bool *found_error = payload;
    if (!*found_error && ts_subtree_is_error(iterator->subtrees.contents[0])) {
      *found_error = true;
      return StackActionPop | StackActionStop;
    } else {
      return StackActionStop;
    }
  } else {
    return StackActionNone;
  }
}